

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::testVerticalHeader(Test *this)

{
  QFont *pQVar1;
  AutoTableElement *pAVar2;
  int iVar3;
  QLatin1String latin1;
  QLatin1String latin1_00;
  QFont aQStack_58 [16];
  AutoTableElement tableElement;
  Report report;
  
  fillModel(this,4,0x14,false);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  latin1.m_data = "Noto Sans";
  latin1.m_size = 9;
  QString::QString((QString *)&tableElement,latin1);
  QFont::QFont(aQStack_58,(QString *)&tableElement,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)&report);
  QFont::~QFont(aQStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  pQVar1 = (QFont *)KDReports::Report::mainTable();
  latin1_00.m_data = "courier";
  latin1_00.m_size = 7;
  QString::QString((QString *)&tableElement,latin1_00);
  QFont::QFont(aQStack_58,(QString *)&tableElement,0x1e,-1,false);
  KDReports::MainTable::setVerticalHeaderFont(pQVar1);
  QFont::~QFont(aQStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&tableElement,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar2 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar2);
  iVar3 = KDReports::Report::numberOfPages();
  QTest::qCompare(iVar3,2,"report.numberOfPages()","2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                  ,0x1b1);
  KDReports::AutoTableElement::~AutoTableElement(&tableElement);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testVerticalHeader()
    {
        // Check that the font for vertical headers is taken into account
        // in the layouting.
        // For that, we make it huge, and we check that the report takes two pages.
        fillModel(4, 20);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 8));
        report.mainTable()->setVerticalHeaderFont(QFont(QLatin1String("courier"), 30));
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(true);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
    }